

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::DefinePropertiesHelperForProxyObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  DescriptorMap *pDVar3;
  PropertyRecord *pPVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  JavascriptArray *pJVar9;
  Recycler *this;
  char *pcVar10;
  undefined4 extraout_var;
  Var pvVar11;
  PropertyRecord *pPVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined1 local_a8 [8];
  TrackAllocData data;
  char *local_48;
  DescriptorMap *descriptors;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)scriptContext;
  bVar5 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(props);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x7b8,"(VarIs<JavascriptProxy>(props))",
                                "VarIs<JavascriptProxy>(props)");
    if (!bVar5) goto LAB_00cf4c19;
    *puVar8 = 0;
  }
  pPVar4 = propertyRecord;
  pJVar9 = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols
                     (props,(ScriptContext *)propertyRecord);
  uVar1 = (pJVar9->super_ArrayObject).length;
  uVar13 = (ulong)uVar1;
  EnterPinnedScope(&local_48);
  local_a8 = (undefined1  [8])
             &DefinePropertiesHelperForProxyObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
              ::DescriptorMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7b17b92;
  data.filename._0_4_ = 0x7cb;
  data.plusSize = uVar13;
  this = Memory::Recycler::TrackAllocInfo
                   ((Recycler *)
                    pPVar4[0xc0].super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject,(TrackAllocData *)local_a8);
  if (uVar13 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    pcVar10 = &DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00cf4c19;
      *puVar8 = 0;
    }
    pcVar10 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                        (this,uVar13 * 0x38);
    if (pcVar10 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) {
LAB_00cf4c19:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pcVar14 = pcVar10;
    do {
      pcVar14[0] = '\0';
      pcVar14[1] = '\0';
      pcVar14[2] = '\0';
      pcVar14[3] = '\0';
      pcVar14[4] = '\0';
      pcVar14[5] = '\0';
      pcVar14[6] = '\0';
      pcVar14[7] = '\0';
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)(pcVar14 + 8));
      pcVar14 = pcVar14 + 0x38;
    } while (pcVar14 != pcVar10 + uVar13 * 0x38);
  }
  descriptors = (DescriptorMap *)0x0;
  uVar16 = 0;
  local_48 = pcVar10;
  if (uVar13 == 0) {
    lVar17 = 0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar17 = 0;
    do {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
      iVar7 = (*(pJVar9->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar9,uVar16);
      pvVar11 = (Var)CONCAT44(extraout_var,iVar7);
      bVar5 = VarIs<Js::JavascriptSymbol>(pvVar11);
      if ((!bVar5) && (bVar5 = VarIs<Js::JavascriptString>(pvVar11), !bVar5)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x7df,
                                    "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                    ,
                                    "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                   );
        if (!bVar5) goto LAB_00cf4c19;
        *puVar8 = 0;
      }
      JavascriptConversion::ToPropertyKey
                (pvVar11,(ScriptContext *)propertyRecord,(PropertyRecord **)&descriptors,
                 (PropertyString **)0x0);
      iVar7 = *(int *)&(descriptors->descriptor).Value.ptr;
      if (iVar7 == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x7e2,"(propertyId != Constants::NoProperty)",
                                    "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty."
                                   );
        if (!bVar5) goto LAB_00cf4c19;
        *puVar8 = 0;
      }
      BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                        (props,*(PropertyId *)&(descriptors->descriptor).Value.ptr,
                         (ScriptContext *)propertyRecord,(PropertyDescriptor *)local_a8);
      if ((BVar6 != 0) &&
         (bVar5 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_a8),
         pPVar4 = propertyRecord, bVar5)) {
        pvVar11 = JavascriptOperators::GetProperty
                            (props,iVar7,(ScriptContext *)propertyRecord,(PropertyValueInfo *)0x0);
        lVar18 = lVar17 * 0x38;
        BVar6 = JavascriptOperators::ToPropertyDescriptor
                          (pvVar11,(PropertyDescriptor *)(local_48 + lVar18 + 8),
                           (ScriptContext *)pPVar4);
        pPVar4 = propertyRecord;
        if (BVar6 == 0) {
          pPVar12 = ScriptContext::GetPropertyName((ScriptContext *)propertyRecord,iVar7);
          JavascriptError::ThrowTypeError((ScriptContext *)pPVar4,-0x7ff5ec2c,(PCWSTR)(pPVar12 + 1))
          ;
        }
        if (DAT_015d346b == '\x01') {
          ModifyGetterSetterFuncName
                    ((PropertyRecord *)descriptors,(PropertyDescriptor *)(local_48 + lVar18 + 8),
                     (ScriptContext *)propertyRecord);
        }
        pDVar3 = descriptors;
        pcVar14 = local_48;
        pcVar10 = local_48 + lVar18;
        Memory::Recycler::WBSetBit(pcVar10);
        *(DescriptorMap **)(pcVar14 + lVar18) = pDVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar10);
        lVar17 = lVar17 + 1;
      }
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
    } while (uVar1 != uVar15);
  }
  if (lVar17 != 0) {
    lVar18 = 8;
    do {
      DefineOwnPropertyHelper
                (object,*(PropertyId *)(*(long *)(local_48 + lVar18 + -8) + 8),
                 (PropertyDescriptor *)(local_48 + lVar18),(ScriptContext *)propertyRecord,true);
      lVar18 = lVar18 + 0x38;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  LeavePinnedScope();
  return object;
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForProxyObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    Assert(VarIs<JavascriptProxy>(props));

    //1.  If Type(O) is not Object throw a TypeError exception.
    //2.  Let props be ToObject(Properties).

    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
    };

    //3.  Let keys be props.[[OwnPropertyKeys]]().
    //4.  ReturnIfAbrupt(keys).
    //5.  Let descriptors be an empty List.
    JavascriptArray* keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(props, scriptContext);
    uint32 length = keys->GetLength();

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, length);

    //6.  Repeat for each element nextKey of keys in List order,
    //    1.  Let propDesc be props.[[GetOwnProperty]](nextKey).
    //    2.  ReturnIfAbrupt(propDesc).
    //    3.  If propDesc is not undefined and propDesc.[[Enumerable]] is true, then
    //        1.  Let descObj be Get(props, nextKey).
    //        2.  ReturnIfAbrupt(descObj).
    //        3.  Let desc be ToPropertyDescriptor(descObj).
    //        4.  ReturnIfAbrupt(desc).
    //        5.  Append the pair(a two element List) consisting of nextKey and desc to the end of descriptors.
    Var nextKey;

    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var descObj;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty.");

        if (JavascriptOperators::GetOwnPropertyDescriptor(props, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                descObj = JavascriptOperators::GetProperty(props, propertyId, scriptContext);

                if (!JavascriptOperators::ToPropertyDescriptor(descObj, &descriptors[descCount].descriptor, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyId)->GetBuffer());
                }

                if (CONFIG_FLAG(UseFullName))
                {
                    ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
                }

                descriptors[descCount].propRecord = propertyRecord;

                descCount++;
            }
        }
    }

    //7.  For each pair from descriptors in list order,
    //    1.  Let P be the first element of pair.
    //    2.  Let desc be the second element of pair.
    //    3.  Let status be DefinePropertyOrThrow(O, P, desc).
    //    4.  ReturnIfAbrupt(status).

    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    //8.  Return O.
    return object;
}